

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

FMFieldList max_field_lists(FMFieldList list1,FMFieldList list2)

{
  FMFieldList p_Var1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 *__dest;
  FMFieldList __base;
  char *pcVar6;
  ulong uVar7;
  undefined8 *puVar8;
  int *piVar9;
  ulong __nmemb;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  
  uVar3 = count_FMfield(list1);
  uVar4 = count_FMfield(list2);
  __dest = (undefined8 *)ffs_malloc((long)(int)uVar4 * 0x18);
  memcpy(__dest,list2,(long)(int)uVar4 * 0x18);
  __base = (FMFieldList)ffs_malloc((long)(int)(uVar4 + uVar3 + 1) * 0x18);
  uVar10 = 0;
  uVar7 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar7 = uVar10;
  }
  __nmemb = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    __nmemb = uVar10;
  }
  do {
    if (uVar10 == __nmemb) {
      for (lVar13 = 0; uVar7 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
        if (*(char **)((long)__dest + lVar13) != (char *)0x0) {
          pcVar6 = strdup(*(char **)((long)__dest + lVar13));
          __base[__nmemb].field_name = pcVar6;
          pcVar6 = strdup(*(char **)((long)__dest + lVar13 + 8));
          __base[__nmemb].field_type = pcVar6;
          uVar2 = *(undefined8 *)((long)__dest + lVar13 + 0x10);
          __base[__nmemb].field_size = (int)uVar2;
          __base[__nmemb].field_offset = (int)((ulong)uVar2 >> 0x20);
          __nmemb = (ulong)((int)__nmemb + 1);
        }
      }
      free(__dest);
      __base[__nmemb].field_name = (char *)0x0;
      __base[__nmemb].field_type = (char *)0x0;
      __base[__nmemb].field_size = 0;
      __base[__nmemb].field_offset = 0;
      qsort(__base,__nmemb,0x18,field_offset_compar);
      piVar9 = &__base[1].field_offset;
      for (uVar7 = 1; uVar7 < __nmemb; uVar7 = uVar7 + 1) {
        if (*piVar9 < piVar9[-7] + piVar9[-6]) {
          *piVar9 = piVar9[-7] + piVar9[-6];
        }
        piVar9 = piVar9 + 6;
      }
      return __base;
    }
    p_Var1 = list1 + uVar10;
    uVar11 = 0;
    puVar8 = __dest;
    while ((uVar12 = uVar7, uVar7 != uVar11 &&
           (((char *)*puVar8 == (char *)0x0 ||
            (iVar5 = strcmp(p_Var1->field_name,(char *)*puVar8), uVar12 = uVar11, iVar5 != 0))))) {
      uVar11 = uVar11 + 1;
      puVar8 = puVar8 + 3;
    }
    if ((uint)uVar12 == uVar4) {
      pcVar6 = strdup(p_Var1->field_name);
      __base[uVar10].field_name = pcVar6;
      pcVar6 = strdup(p_Var1->field_type);
      __base[uVar10].field_type = pcVar6;
      iVar5 = p_Var1->field_offset;
      __base[uVar10].field_size = p_Var1->field_size;
      __base[uVar10].field_offset = iVar5;
    }
    else {
      iVar5 = field_type_eq(p_Var1->field_type,(char *)__dest[(uVar12 & 0xffffffff) * 3 + 1]);
      if (iVar5 == 0) {
        free(__dest);
        free(__base);
        return (FMFieldList)0x0;
      }
      pcVar6 = strdup(p_Var1->field_name);
      __base[uVar10].field_name = pcVar6;
      pcVar6 = strdup(p_Var1->field_type);
      __base[uVar10].field_type = pcVar6;
      iVar5 = *(int *)(__dest + (uVar12 & 0xffffffff) * 3 + 2);
      if (iVar5 < p_Var1->field_size) {
        iVar5 = p_Var1->field_size;
      }
      __base[uVar10].field_size = iVar5;
      __base[uVar10].field_offset = p_Var1->field_offset;
      __dest[(uVar12 & 0xffffffff) * 3] = 0;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

extern
FMFieldList
max_field_lists(FMFieldList list1, FMFieldList list2)
{
    FMFieldList max_field_list = NULL;
    FMFieldList tlist2;
    int field_count1 = count_FMfield(list1);
    int field_count2 = count_FMfield(list2);
    int max_field_count = 0;
    int i, j;

    /* make a copy of list2 that we can scratch on */
    tlist2 = (FMFieldList) malloc((size_t) sizeof(FMField) * field_count2);
    memcpy(tlist2, list2, sizeof(FMField) * field_count2);

    max_field_list = (FMFieldList) malloc((size_t) sizeof(FMField) *
				      (field_count1 + field_count2 + 1));

    for (i = 0; i < field_count1; i++) {
	/* for each field in list1 */
	for (j = 0; j < field_count2; j++) {
	    if (tlist2[j].field_name &&
	      (strcmp(list1[i].field_name, tlist2[j].field_name) == 0)) {
		break;
	    }
	}
	if (j == field_count2) {
	    /* field exists only in 1, use it as is */
	    max_field_list[max_field_count].field_name =
		strdup(list1[i].field_name);
	    max_field_list[max_field_count].field_type =
		strdup(list1[i].field_type);
	    max_field_list[max_field_count].field_size =
		list1[i].field_size;
	    max_field_list[max_field_count].field_offset =
		list1[i].field_offset;
	    max_field_count++;
	} else {
	    /* field list in both.  Check types and take max size */
	    if (!field_type_eq(list1[i].field_type, tlist2[j].field_type)) {
		/* Yikes!  Types are bad!  Serious problem */
		free(tlist2);
		free(max_field_list);
		return NULL;
	    }
	    max_field_list[max_field_count].field_name =
		strdup(list1[i].field_name);
	    max_field_list[max_field_count].field_type =
		strdup(list1[i].field_type);
	    max_field_list[max_field_count].field_size =
		Max(list1[i].field_size, tlist2[j].field_size);
	    /* tentative offset */
	    max_field_list[max_field_count].field_offset =
		list1[i].field_offset;
	    max_field_count++;
	    /* mark field in list 2 as used */
	    tlist2[j].field_name = NULL;
	}
    }
    for (j = 0; j < field_count2; j++) {
	if (tlist2[j].field_name != NULL) {
	    /* didn't mark this field as used.  Must only be in list2 */
	    max_field_list[max_field_count].field_name =
		strdup(tlist2[j].field_name);
	    max_field_list[max_field_count].field_type =
		strdup(tlist2[j].field_type);
	    max_field_list[max_field_count].field_size =
		tlist2[j].field_size;
	    max_field_list[max_field_count].field_offset =
		tlist2[j].field_offset;
	    max_field_count++;
	}
    }
    free(tlist2);

    max_field_list[max_field_count].field_name = NULL;
    max_field_list[max_field_count].field_type = NULL;
    max_field_list[max_field_count].field_size = 0;
    max_field_list[max_field_count].field_offset = 0;

    /* sort the max list by offset now */
    qsort(max_field_list, max_field_count, sizeof(FMField),
	  field_offset_compar);
    for (i = 1; i < max_field_count; i++) {
	int last_field_end = max_field_list[i - 1].field_offset +
	max_field_list[i - 1].field_size;
	if (max_field_list[i].field_offset < last_field_end) {
	    /* damn, got some overlap.  Push this field up to fix. */
	    max_field_list[i].field_offset = last_field_end;
	}
    }
    return max_field_list;
}